

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

void P_SpawnLinePortal(line_t_conflict *line)

{
  FLinePortal *pFVar1;
  double *pdVar2;
  FLinePortal *pFVar3;
  BYTE BVar4;
  int iVar5;
  int iVar6;
  line_t_conflict *plVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  if ((uint)line->args[2] < 4) {
    plVar7 = FindDestination(line,line->args[0]);
    TArray<FLinePortal,_FLinePortal>::Grow(&linePortals,1);
    uVar8 = (ulong)linePortals.Count;
    uVar10 = linePortals.Count + 1;
    line->portalindex = linePortals.Count;
    linePortals.Count = uVar10;
    pFVar1 = linePortals.Array + uVar8;
    pFVar1->mSinRot = 0.0;
    pFVar1->mCosRot = 0.0;
    pFVar1->mType = '\0';
    pFVar1->mFlags = '\0';
    pFVar1->mDefFlags = '\0';
    pFVar1->mAlign = '\0';
    *(undefined4 *)&pFVar1->field_0x24 = 0;
    (pFVar1->mAngleDiff).Degrees = 0.0;
    (pFVar1->mDisplacement).X = 0.0;
    (pFVar1->mDisplacement).Y = 0.0;
    pFVar1->render_thinglist = (portnode_t *)0x0;
    pFVar1->mOrigin = (line_t *)line;
    pFVar1->mDestination = (line_t *)plVar7;
    uVar10 = line->args[2];
    BVar4 = (BYTE)uVar10;
    pFVar1->mType = BVar4;
    if ((uVar10 & 0xff) != 3) {
      uVar10 = 0;
      if ((uint)line->args[3] < 3) {
        uVar10 = line->args[3];
      }
      pFVar1->mAlign = (BYTE)uVar10;
      if ((BYTE)uVar10 != '\0' && BVar4 == '\x02') {
        Printf("\x1cGWarning: z-offsetting not allowed for interactive portals. Changing line %d to teleport-portal!\n"
               ,(ulong)(uint)((int)((ulong)((long)line - (long)lines) >> 3) * 0x286bca1b));
        pFVar1->mType = '\x01';
        plVar7 = (line_t_conflict *)pFVar1->mDestination;
        BVar4 = '\x01';
      }
    }
    if (plVar7 != (line_t_conflict *)0x0) {
      bVar9 = 1;
      if (BVar4 != '\0') {
        bVar9 = (BVar4 != '\x01') << 3 | 7;
      }
      pFVar1->mDefFlags = bVar9;
    }
  }
  else if ((line->args[2] == 4) && (line->args[0] == 0)) {
    iVar5 = FTagManager::GetFirstLineID(&tagManager,line);
    if (0 < numlines) {
      lVar12 = 0;
      lVar11 = 0;
      do {
        iVar6 = FTagManager::GetFirstLineID
                          (&tagManager,(line_t_conflict *)((long)lines->args + lVar12 + -0x2c));
        if (((iVar6 == iVar5) && (*(int *)((long)lines->args + lVar12) == 1)) &&
           (*(int *)((long)lines->args + lVar12 + -4) == 0x9c)) {
          TArray<FLinePortal,_FLinePortal>::Grow(&linePortals,1);
          uVar8 = (ulong)linePortals.Count;
          uVar10 = linePortals.Count + 1;
          line->portalindex = linePortals.Count;
          linePortals.Count = uVar10;
          pFVar3 = linePortals.Array;
          pFVar1 = linePortals.Array + uVar8;
          pFVar1->mCosRot = 0.0;
          (&pFVar1->mCosRot)[1] = 0.0;
          pFVar3[uVar8].mAngleDiff.Degrees = 0.0;
          (&pFVar3[uVar8].mAngleDiff)[1] = 0.0;
          pdVar2 = &pFVar3[uVar8].mDisplacement.Y;
          *pdVar2 = 0.0;
          pdVar2[1] = 0.0;
          pFVar3[uVar8].mDestination = (line_t *)0x0;
          ((DVector2 *)(&pFVar3[uVar8].mDestination + 1))->X = 0.0;
          pFVar3[uVar8].mOrigin = (line_t *)line;
          pFVar3[uVar8].mDestination = (line_t *)((long)lines->args + lVar12 + -0x2c);
          pFVar3[uVar8].mType = '\x03';
          pFVar3[uVar8].mDefFlags = '\x0f';
          TArray<FLinePortal,_FLinePortal>::Grow(&linePortals,1);
          uVar8 = (ulong)linePortals.Count;
          uVar10 = linePortals.Count + 1;
          *(uint *)((long)lines->bbox + lVar12 + 0x38) = linePortals.Count;
          linePortals.Count = uVar10;
          pFVar3 = linePortals.Array;
          pFVar1 = linePortals.Array + uVar8;
          pFVar1->mSinRot = 0.0;
          (&pFVar1->mSinRot)[1] = 0.0;
          pFVar1 = pFVar3 + uVar8;
          pFVar1->mType = '\0';
          pFVar1->mFlags = '\0';
          pFVar1->mDefFlags = '\0';
          pFVar1->mAlign = '\0';
          *(undefined4 *)&pFVar1->field_0x24 = 0;
          ((DAngle *)(&pFVar1->mType + 8))->Degrees = 0.0;
          pFVar3[uVar8].mDisplacement.X = 0.0;
          pFVar3[uVar8].mDisplacement.Y = 0.0;
          pFVar3[uVar8].mOrigin = (line_t *)0x0;
          pFVar3[uVar8].mDestination = (line_t *)0x0;
          pFVar3[uVar8].render_thinglist = (portnode_t *)0x0;
          pFVar3[uVar8].mOrigin = (line_t *)((long)lines->args + lVar12 + -0x2c);
          pFVar3[uVar8].mDestination = (line_t *)line;
          pFVar3[uVar8].mType = '\x03';
          pFVar3[uVar8].mDefFlags = '\x0f';
        }
        lVar11 = lVar11 + 1;
        lVar12 = lVar12 + 0x98;
      } while (lVar11 < numlines);
    }
  }
  return;
}

Assistant:

void P_SpawnLinePortal(line_t* line)
{
	// portal destination is special argument #0
	line_t* dst = NULL;

	if (line->args[2] >= PORTT_VISUAL && line->args[2] <= PORTT_LINKED)
	{
		dst = FindDestination(line, line->args[0]);

		line->portalindex = linePortals.Reserve(1);
		FLinePortal *port = &linePortals.Last();

		memset(port, 0, sizeof(FLinePortal));
		port->mOrigin = line;
		port->mDestination = dst;
		port->mType = BYTE(line->args[2]);	// range check is done above.

		if (port->mType == PORTT_LINKED)
		{
			// Linked portals have no z-offset ever.
			port->mAlign = PORG_ABSOLUTE;
		}
		else
		{
			port->mAlign = BYTE(line->args[3] >= PORG_ABSOLUTE && line->args[3] <= PORG_CEILING ? line->args[3] : PORG_ABSOLUTE);
			if (port->mType == PORTT_INTERACTIVE && port->mAlign != PORG_ABSOLUTE)
			{
				// Due to the way z is often handled, these pose a major issue for parts of the code that needs to transparently handle interactive portals.
				Printf(TEXTCOLOR_RED "Warning: z-offsetting not allowed for interactive portals. Changing line %d to teleport-portal!\n", int(line - lines));
				port->mType = PORTT_TELEPORT;
			}
		}
		if (port->mDestination != NULL)
		{
			port->mDefFlags = port->mType == PORTT_VISUAL ? PORTF_VISIBLE : port->mType == PORTT_TELEPORT ? PORTF_TYPETELEPORT : PORTF_TYPEINTERACTIVE;
		}
	}
	else if (line->args[2] == PORTT_LINKEDEE && line->args[0] == 0)
	{
		// EE-style portals require that the first line ID is identical and the first arg of the two linked linedefs are 0 and 1 respectively.

		int mytag = tagManager.GetFirstLineID(line);

		for (int i = 0; i < numlines; i++)
		{
			if (tagManager.GetFirstLineID(&lines[i]) == mytag && lines[i].args[0] == 1 && lines[i].special == Line_SetPortal)
			{
				line->portalindex = linePortals.Reserve(1);
				FLinePortal *port = &linePortals.Last();

				memset(port, 0, sizeof(FLinePortal));
				port->mOrigin = line;
				port->mDestination = &lines[i];
				port->mType = PORTT_LINKED;
				port->mAlign = PORG_ABSOLUTE;
				port->mDefFlags = PORTF_TYPEINTERACTIVE;

				// we need to create the backlink here, too.
				lines[i].portalindex = linePortals.Reserve(1);
				port = &linePortals.Last();

				memset(port, 0, sizeof(FLinePortal));
				port->mOrigin = &lines[i];
				port->mDestination = line;
				port->mType = PORTT_LINKED;
				port->mAlign = PORG_ABSOLUTE;
				port->mDefFlags = PORTF_TYPEINTERACTIVE;
			}
		}
	}
	else
	{
		// undefined type
		return;
	}
}